

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  size_t nblimbs;
  
  iVar3 = 0;
  if (X != Y) {
    if (Y->p == (mbedtls_mpi_uint *)0x0) {
      mbedtls_mpi_free(X);
      iVar3 = 0;
    }
    else {
      lVar1 = Y->n * -8;
      sVar2 = Y->n;
      do {
        nblimbs = sVar2;
        lVar4 = lVar1;
        if (nblimbs == 1) break;
        lVar1 = lVar4 + 8;
        sVar2 = nblimbs - 1;
      } while (Y->p[nblimbs - 1] == 0);
      X->s = Y->s;
      iVar3 = mbedtls_mpi_grow(X,nblimbs);
      if (iVar3 == 0) {
        memset(X->p,0,X->n << 3);
        memcpy(X->p,Y->p,-lVar4);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_copy( mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    int ret;
    size_t i;

    if( X == Y )
        return( 0 );

    if( Y->p == NULL )
    {
        mbedtls_mpi_free( X );
        return( 0 );
    }

    for( i = Y->n - 1; i > 0; i-- )
        if( Y->p[i] != 0 )
            break;
    i++;

    X->s = Y->s;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i ) );

    memset( X->p, 0, X->n * ciL );
    memcpy( X->p, Y->p, i * ciL );

cleanup:

    return( ret );
}